

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::PageSegmentBase
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *allocator,bool committed,bool allocated,bool enableWriteBarrier)

{
  undefined1 *puVar1;
  PageBitVector *this_00;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BVIndex BVar5;
  undefined4 *puVar6;
  
  SegmentBase<Memory::VirtualAllocWrapper>::SegmentBase
            (&this->super_SegmentBase<Memory::VirtualAllocWrapper>,allocator,
             (ulong)allocator->maxAllocPageCount,enableWriteBarrier);
  this->decommitPageCount = 0;
  (this->freePages).data[0].word = 0;
  (this->freePages).data[1].word = 0;
  (this->freePages).data[2].word = 0;
  (this->freePages).data[3].word = 0;
  (this->freePages).data[4].word = 0;
  (this->decommitPages).data[0].word = 0;
  (this->decommitPages).data[1].word = 0;
  (this->decommitPages).data[2].word = 0;
  (this->decommitPages).data[3].word = 0;
  (this->decommitPages).data[4].word = 0;
  puVar1 = &(this->super_SegmentBase<Memory::VirtualAllocWrapper>).field_0x2c;
  *puVar1 = *puVar1 | 4;
  if ((this->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount !=
      (ulong)(allocator->secondaryAllocPageCount + allocator->maxAllocPageCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xe0,
                       "(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount)"
                       ,
                       "this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount"
                      );
    if (!bVar3) goto LAB_0066eb8b;
    *puVar6 = 0;
  }
  this_00 = &this->freePages;
  if (committed) {
    if (allocated) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xe6,"(!allocated)","!allocated");
      if (!bVar3) goto LAB_0066eb8b;
      *puVar6 = 0;
    }
    uVar4 = GetAvailablePageCount(this);
    this->freePageCount = uVar4;
    BVStatic<272UL>::SetRange(this_00,0,uVar4);
    BVar5 = this->freePageCount;
    if (BVar5 != 0x110) {
      BVStatic<272UL>::ClearRange(this_00,BVar5,0x110 - BVar5);
    }
    BVar5 = BVStatic<272UL>::Count(this_00);
    if (BVar5 != this->freePageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xee,"(this->GetCountOfFreePages() == this->freePageCount)",
                         "this->GetCountOfFreePages() == this->freePageCount");
      if (!bVar3) {
LAB_0066eb8b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  else {
    this->freePageCount = 0;
    (this->freePages).data[2].word = 0;
    (this->freePages).data[3].word = 0;
    this_00->data[0].word = 0;
    (this->freePages).data[1].word = 0;
    (this->freePages).data[4].word = 0;
    if (!allocated) {
      uVar4 = GetAvailablePageCount(this);
      this->decommitPageCount = uVar4;
      BVStatic<272UL>::SetRange(&this->decommitPages,0,uVar4);
      BVar5 = this->decommitPageCount;
      if (BVar5 != 0x110) {
        BVStatic<272UL>::ClearRange(&this->decommitPages,BVar5,0x110 - BVar5);
      }
    }
  }
  return;
}

Assistant:

PageSegmentBase<T>::PageSegmentBase(PageAllocatorBase<T> * allocator, bool committed, bool allocated, bool enableWriteBarrier) :
    SegmentBase<T>(allocator, allocator->maxAllocPageCount, enableWriteBarrier), decommitPageCount(0)
{
#if DBG
    this->isPageSegment = true;
#endif // DBG
    Assert(this->segmentPageCount == allocator->maxAllocPageCount + allocator->secondaryAllocPageCount);

    uint maxPageCount = GetMaxPageCount();

    if (committed)
    {
        Assert(!allocated);
        this->freePageCount = this->GetAvailablePageCount();
        this->SetRangeInFreePagesBitVector(0, this->freePageCount);
        if (this->freePageCount != maxPageCount)
        {
            this->ClearRangeInFreePagesBitVector(this->freePageCount, (maxPageCount - this->freePageCount));
        }

        Assert(this->GetCountOfFreePages() == this->freePageCount);
    }
    else
    {
        this->freePageCount = 0;
        this->ClearAllInFreePagesBitVector();
        if (!allocated)
        {
            this->decommitPageCount = this->GetAvailablePageCount();
            this->SetRangeInDecommitPagesBitVector(0, this->decommitPageCount);

            if (this->decommitPageCount != maxPageCount)
            {
                this->ClearRangeInDecommitPagesBitVector(this->decommitPageCount, (maxPageCount - this->decommitPageCount));
            }
        }
    }
}